

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_MAD(Context *ctx)

{
  size_t in_RCX;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char code [128];
  
  make_GLSL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_GLSL_srcarg_string_masked(ctx,1,src1,in_RCX);
  make_GLSL_srcarg_string_masked(ctx,2,src2,in_RCX);
  make_GLSL_destarg_assign(ctx,code,0x80,"(%s * %s) + %s",src0,src1,src2);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_MAD(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_GLSL_srcarg_string_masked(ctx, 2, src2, sizeof (src2));
    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "(%s * %s) + %s", src0, src1, src2);
    output_line(ctx, "%s", code);
}